

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_cnv.cpp
# Opt level: O2

void ucnv_toUWriteUChars_63
               (UConverter *cnv,UChar *uchars,int32_t length,UChar **target,UChar *targetLimit,
               int32_t **offsets,int32_t sourceIndex,UErrorCode *pErrorCode)

{
  UChar UVar1;
  UChar *pUVar2;
  long lVar3;
  uint uVar4;
  int32_t *piVar5;
  
  pUVar2 = *target;
  if ((offsets == (int32_t **)0x0) || (piVar5 = *offsets, piVar5 == (int32_t *)0x0)) {
    for (; (0 < length && (pUVar2 < targetLimit)); pUVar2 = pUVar2 + 1) {
      UVar1 = *uchars;
      uchars = uchars + 1;
      *pUVar2 = UVar1;
      length = length + -1;
    }
  }
  else {
    for (; (0 < length && (pUVar2 < targetLimit)); pUVar2 = pUVar2 + 1) {
      UVar1 = *uchars;
      uchars = uchars + 1;
      *pUVar2 = UVar1;
      *piVar5 = sourceIndex;
      piVar5 = piVar5 + 1;
      length = length + -1;
    }
    *offsets = piVar5;
  }
  *target = pUVar2;
  if (0 < length) {
    if (cnv != (UConverter *)0x0) {
      cnv->UCharErrorBufferLength = (int8_t)length;
      uVar4 = length + 1;
      lVar3 = 0;
      do {
        *(undefined2 *)((long)cnv->UCharErrorBuffer + lVar3) = *(undefined2 *)((long)uchars + lVar3)
        ;
        uVar4 = uVar4 - 1;
        lVar3 = lVar3 + 2;
      } while (1 < uVar4);
    }
    *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
  }
  return;
}

Assistant:

U_CFUNC void
ucnv_toUWriteUChars(UConverter *cnv,
                    const UChar *uchars, int32_t length,
                    UChar **target, const UChar *targetLimit,
                    int32_t **offsets,
                    int32_t sourceIndex,
                    UErrorCode *pErrorCode) {
    UChar *t=*target;
    int32_t *o;

    /* write UChars */
    if(offsets==NULL || (o=*offsets)==NULL) {
        while(length>0 && t<targetLimit) {
            *t++=*uchars++;
            --length;
        }
    } else {
        /* output with offsets */
        while(length>0 && t<targetLimit) {
            *t++=*uchars++;
            *o++=sourceIndex;
            --length;
        }
        *offsets=o;
    }
    *target=t;

    /* write overflow */
    if(length>0) {
        if(cnv!=NULL) {
            t=cnv->UCharErrorBuffer;
            cnv->UCharErrorBufferLength=(int8_t)length;
            do {
                *t++=*uchars++;
            } while(--length>0);
        }
        *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
    }
}